

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bstricmp(const_bstring b0,const_bstring b1)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *puVar4;
  int iVar5;
  __int32_t **pp_Var6;
  ulong uVar7;
  uint uVar8;
  
  if (b0 == (const_bstring)0x0) {
    return -0x8000;
  }
  puVar3 = b0->data;
  if (puVar3 == (uchar *)0x0) {
    return -0x8000;
  }
  uVar1 = b0->slen;
  if (b1 == (const_bstring)0x0 || (int)uVar1 < 0) {
    return -0x8000;
  }
  puVar4 = b1->data;
  if (puVar4 != (uchar *)0x0) {
    uVar2 = b1->slen;
    if ((int)uVar2 < 0) {
      return -0x8000;
    }
    uVar8 = uVar2;
    if (((int)uVar2 < (int)uVar1) || (uVar8 = uVar1, puVar3 != puVar4 || uVar1 != uVar2)) {
      if (0 < (int)uVar8) {
        pp_Var6 = __ctype_tolower_loc();
        uVar7 = 0;
        do {
          iVar5 = (int)(char)(*pp_Var6)[puVar3[uVar7]] - (int)(char)(*pp_Var6)[puVar4[uVar7]];
          if (iVar5 != 0) {
            return iVar5;
          }
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
      if ((int)uVar8 < (int)uVar1) {
        pp_Var6 = __ctype_tolower_loc();
        if ((char)(*pp_Var6)[puVar3[uVar8]] == '\0') {
          return 0x100;
        }
        return (int)(char)(*pp_Var6)[puVar3[uVar8]];
      }
      if ((int)uVar8 < (int)uVar2) {
        pp_Var6 = __ctype_tolower_loc();
        if ((*pp_Var6)[puVar4[uVar8]] << 0x18 != 0) {
          return -(((*pp_Var6)[puVar4[uVar8]] << 0x18) >> 0x18);
        }
        return -0x100;
      }
    }
    return 0;
  }
  return -0x8000;
}

Assistant:

int bstricmp (const_bstring b0, const_bstring b1) {
int i, v, n;

	if (bdata (b0) == NULL || b0->slen < 0 ||
	    bdata (b1) == NULL || b1->slen < 0) return SHRT_MIN;
	if ((n = b0->slen) > b1->slen) n = b1->slen;
	else if (b0->slen == b1->slen && b0->data == b1->data) return BSTR_OK;

	for (i = 0; i < n; i ++) {
		v  = (char) downcase (b0->data[i])
		   - (char) downcase (b1->data[i]);
		if (0 != v) return v;
	}

	if (b0->slen > n) {
		v = (char) downcase (b0->data[n]);
		if (v) return v;
		return UCHAR_MAX + 1;
	}
	if (b1->slen > n) {
		v = - (char) downcase (b1->data[n]);
		if (v) return v;
		return - (int) (UCHAR_MAX + 1);
	}
	return BSTR_OK;
}